

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop;
  uv_loop_t *puVar3;
  uv_loop_t *handle;
  long lVar4;
  int fds_stdout [2];
  int fds_stdin [2];
  uv_stdio_container_t child_stdio [2];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_child;
  uv_process_t child_req;
  uv_write_t write_req;
  uchar ubuf [1023];
  undefined1 local_9d8 [12];
  uv_file local_9cc;
  uv_buf_t local_9c8;
  anon_union_16_2_bf76bca6_for_active_reqs local_9b8;
  uint local_9a8;
  uv_loop_t *local_9a0;
  undefined1 local_990 [264];
  undefined1 local_888 [264];
  undefined1 local_780 [264];
  undefined1 local_678 [400];
  undefined1 local_4e8 [1224];
  
  handle = (uv_loop_t *)local_9d8;
  init_process_options("spawn_helper9",exit_cb);
  loop = uv_default_loop();
  puVar3 = loop;
  iVar1 = uv_pipe_init(loop,(uv_pipe_t *)local_678,0);
  if (iVar1 == 0) {
    puVar3 = loop;
    iVar1 = uv_pipe_init(loop,(uv_pipe_t *)local_780,0);
    if (iVar1 != 0) goto LAB_0016ca2c;
    puVar3 = loop;
    iVar1 = uv_pipe_init(loop,(uv_pipe_t *)local_888,0);
    if (iVar1 != 0) goto LAB_0016ca31;
    puVar3 = loop;
    iVar1 = uv_pipe_init(loop,(uv_pipe_t *)local_990,0);
    if (iVar1 != 0) goto LAB_0016ca36;
    puVar3 = (uv_loop_t *)(local_9d8 + 8);
    iVar1 = mpipe((int *)puVar3);
    if (iVar1 == -1) goto LAB_0016ca3b;
    iVar1 = mpipe((int *)local_9d8);
    if (iVar1 == -1) goto LAB_0016ca40;
    handle = (uv_loop_t *)local_678;
    iVar1 = uv_pipe_open((uv_pipe_t *)handle,local_9d8._8_4_);
    if (iVar1 != 0) goto LAB_0016ca45;
    handle = (uv_loop_t *)local_780;
    iVar1 = uv_pipe_open((uv_pipe_t *)handle,local_9d8._4_4_);
    if (iVar1 != 0) goto LAB_0016ca4a;
    handle = (uv_loop_t *)local_888;
    iVar1 = uv_pipe_open((uv_pipe_t *)handle,local_9cc);
    if (iVar1 != 0) goto LAB_0016ca4f;
    handle = (uv_loop_t *)local_990;
    iVar1 = uv_pipe_open((uv_pipe_t *)handle,local_9d8._0_4_);
    if (iVar1 != 0) goto LAB_0016ca54;
    handle = (uv_loop_t *)local_678;
    iVar1 = uv_is_readable((uv_stream_t *)handle);
    if (iVar1 == 0) goto LAB_0016ca59;
    handle = (uv_loop_t *)local_780;
    iVar1 = uv_is_writable((uv_stream_t *)handle);
    if (iVar1 == 0) goto LAB_0016ca5e;
    handle = (uv_loop_t *)local_888;
    iVar1 = uv_is_writable((uv_stream_t *)handle);
    if (iVar1 == 0) goto LAB_0016ca63;
    handle = (uv_loop_t *)local_990;
    iVar1 = uv_is_readable((uv_stream_t *)handle);
    if (iVar1 == 0) goto LAB_0016ca68;
    iVar1 = uv_is_writable((uv_stream_t *)local_678);
    handle = (uv_loop_t *)local_780;
    iVar2 = uv_is_readable((uv_stream_t *)local_780);
    if (iVar2 != iVar1) goto LAB_0016ca6d;
    handle = (uv_loop_t *)local_888;
    iVar2 = uv_is_readable((uv_stream_t *)handle);
    if (iVar2 != iVar1) goto LAB_0016ca72;
    handle = (uv_loop_t *)local_990;
    iVar2 = uv_is_writable((uv_stream_t *)handle);
    if (iVar2 != iVar1) goto LAB_0016ca77;
    options.stdio = (uv_stdio_container_t *)&local_9b8;
    local_9b8.count = 4;
    local_9a8 = 4;
    options.stdio_count = 2;
    handle = loop;
    local_9b8.unused[1] = (uv_stream_t *)local_678;
    local_9a0 = (uv_loop_t *)local_780;
    iVar1 = uv_spawn(loop,(uv_process_t *)(local_678 + 0x108),&options);
    if (iVar1 != 0) goto LAB_0016ca7c;
    lVar4 = 0;
    uv_close((uv_handle_t *)local_678,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)local_780,(uv_close_cb)0x0);
    local_9c8 = uv_buf_init(local_4e8 + 0xc0,0x3ff);
    do {
      local_4e8[lVar4 + 0xc0] = (char)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x3ff);
    memset(output,0,0x3ff);
    handle = (uv_loop_t *)local_4e8;
    iVar1 = uv_write((uv_write_t *)handle,(uv_stream_t *)local_888,&local_9c8,1,write_cb);
    if (iVar1 != 0) goto LAB_0016ca81;
    handle = (uv_loop_t *)local_990;
    iVar1 = uv_read_start((uv_stream_t *)handle,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016ca86;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016ca8b;
    if (exit_cb_called != 1) goto LAB_0016ca90;
    if (close_cb_called != 3) goto LAB_0016ca95;
    loop = (uv_loop_t *)(local_4e8 + 0xc0);
    iVar1 = bcmp(loop,output,0x3ff);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016ca9f;
    }
  }
  else {
    run_test_spawn_inherit_streams_cold_1();
LAB_0016ca2c:
    run_test_spawn_inherit_streams_cold_2();
LAB_0016ca31:
    run_test_spawn_inherit_streams_cold_3();
LAB_0016ca36:
    run_test_spawn_inherit_streams_cold_4();
LAB_0016ca3b:
    handle = puVar3;
    run_test_spawn_inherit_streams_cold_25();
LAB_0016ca40:
    run_test_spawn_inherit_streams_cold_24();
LAB_0016ca45:
    run_test_spawn_inherit_streams_cold_5();
LAB_0016ca4a:
    run_test_spawn_inherit_streams_cold_6();
LAB_0016ca4f:
    run_test_spawn_inherit_streams_cold_7();
LAB_0016ca54:
    run_test_spawn_inherit_streams_cold_8();
LAB_0016ca59:
    run_test_spawn_inherit_streams_cold_23();
LAB_0016ca5e:
    run_test_spawn_inherit_streams_cold_22();
LAB_0016ca63:
    run_test_spawn_inherit_streams_cold_21();
LAB_0016ca68:
    run_test_spawn_inherit_streams_cold_20();
LAB_0016ca6d:
    run_test_spawn_inherit_streams_cold_9();
LAB_0016ca72:
    run_test_spawn_inherit_streams_cold_10();
LAB_0016ca77:
    run_test_spawn_inherit_streams_cold_11();
LAB_0016ca7c:
    run_test_spawn_inherit_streams_cold_12();
LAB_0016ca81:
    run_test_spawn_inherit_streams_cold_13();
LAB_0016ca86:
    loop = handle;
    run_test_spawn_inherit_streams_cold_14();
LAB_0016ca8b:
    run_test_spawn_inherit_streams_cold_15();
LAB_0016ca90:
    run_test_spawn_inherit_streams_cold_16();
LAB_0016ca95:
    run_test_spawn_inherit_streams_cold_17();
  }
  run_test_spawn_inherit_streams_cold_18();
LAB_0016ca9f:
  run_test_spawn_inherit_streams_cold_19();
  iVar1 = pipe((int *)loop);
  if (iVar1 != -1) {
    iVar1 = fcntl64(*(undefined4 *)&loop->data,2,1);
    if ((iVar1 != -1) && (iVar1 = fcntl64(*(undefined4 *)((long)&loop->data + 4),2,1), iVar1 != -1))
    {
      return 0;
    }
    close(*(int *)&loop->data);
    close(*(int *)((long)&loop->data + 4));
  }
  return -1;
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  int fds_stdin[2];
  int fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT(uv_pipe_init(loop, &pipe_stdin_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0);

  ASSERT(mpipe(fds_stdin) != -1);
  ASSERT(mpipe(fds_stdout) != -1);

  ASSERT(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir);
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *)&pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *)&pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT(uv_spawn(loop, &child_req, &options) == 0);

  uv_close((uv_handle_t*)&pipe_stdin_child, NULL);
  uv_close((uv_handle_t*)&pipe_stdout_child, NULL);

  buf = uv_buf_init((char*)ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*)&pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*)&pipe_stdout_parent, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}